

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

Interval * deqp::gls::BuiltinPrecisionTests::ScalarTraits<float>::doMakeIVal(float *value)

{
  float fVar1;
  double dVar2;
  Interval *in_RDI;
  double dVar3;
  
  fVar1 = *value;
  dVar3 = (double)fVar1;
  in_RDI->m_hasNaN = NAN(fVar1);
  dVar2 = dVar3;
  if (NAN(fVar1)) {
    dVar3 = -INFINITY;
    dVar2 = INFINITY;
  }
  in_RDI->m_lo = dVar2;
  in_RDI->m_hi = dVar3;
  return in_RDI;
}

Assistant:

static Interval		doMakeIVal		(const T& value)
	{
		// Thankfully all scalar types have a well-defined conversion to `double`,
		// hence Interval can represent their ranges without problems.
		return Interval(double(value));
	}